

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall
kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
          (BufferedOutputStreamWrapper *this,OutputStream *inner,ArrayPtr<unsigned_char> buffer)

{
  size_t sVar1;
  uchar *puVar2;
  
  sVar1 = buffer.size_;
  puVar2 = buffer.ptr;
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_001c8700;
  this->inner = inner;
  if (sVar1 == 0) {
    heapArray<unsigned_char>(&this->ownedBuffer,0x2000);
    puVar2 = (this->ownedBuffer).ptr;
    sVar1 = (this->ownedBuffer).size_;
  }
  else {
    (this->ownedBuffer).ptr = (uchar *)0x0;
    (this->ownedBuffer).size_ = 0;
    (this->ownedBuffer).disposer = (ArrayDisposer *)0x0;
  }
  (this->buffer).ptr = puVar2;
  (this->buffer).size_ = sVar1;
  this->bufferPos = puVar2;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

BufferedOutputStreamWrapper::BufferedOutputStreamWrapper(OutputStream& inner, ArrayPtr<byte> buffer)
    : inner(inner),
      ownedBuffer(buffer == nullptr ? heapArray<byte>(8192) : nullptr),
      buffer(buffer == nullptr ? ownedBuffer : buffer),
      bufferPos(this->buffer.begin()) {}